

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

void * luaL_testudata(lua_State *L,int ud,char *tname)

{
  int iVar1;
  void *pvVar2;
  
  pvVar2 = lua_touserdata(L,ud);
  if ((pvVar2 != (void *)0x0) && (iVar1 = lua_getmetatable(L,ud), iVar1 != 0)) {
    lua_getfield(L,-0xf4628,tname);
    iVar1 = lua_rawequal(L,-1,-2);
    if (iVar1 == 0) {
      pvVar2 = (void *)0x0;
    }
    lua_settop(L,-3);
    return pvVar2;
  }
  return (void *)0x0;
}

Assistant:

LUALIB_API void *luaL_testudata (lua_State *L, int ud, const char *tname) {
  void *p = lua_touserdata(L, ud);
  if (p != NULL) {  /* value is a userdata? */
    if (lua_getmetatable(L, ud)) {  /* does it have a metatable? */
      luaL_getmetatable(L, tname);  /* get correct metatable */
      if (!lua_rawequal(L, -1, -2))  /* not the same? */
        p = NULL;  /* value is a userdata with wrong metatable */
      lua_pop(L, 2);  /* remove both metatables */
      return p;
    }
  }
  return NULL;  /* value is not a userdata with a metatable */
}